

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O0

GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *
__thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
MemberReserve(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *this,SizeType newCapacity,MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator)

{
  void *pvVar1;
  uint in_ESI;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_RDI;
  void *in_stack_fffffffffffffff0;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *in_stack_fffffffffffffff8;
  
  if ((in_RDI->data_).s.hashcode < in_ESI) {
    pvVar1 = MemoryPoolAllocator<rapidjson::CrtAllocator>::Realloc
                       (in_stack_fffffffffffffff8,in_stack_fffffffffffffff0,(size_t)in_RDI,
                        (size_t)in_RDI);
    (in_RDI->data_).s.str =
         (Ch *)((ulong)(in_RDI->data_).s.str & 0xffff000000000000 | (ulong)pvVar1);
    (in_RDI->data_).s.hashcode = in_ESI;
  }
  return in_RDI;
}

Assistant:

GenericValue& MemberReserve(SizeType newCapacity, Allocator &allocator) {
        RAPIDJSON_ASSERT(IsObject());
        if (newCapacity > data_.o.capacity) {
            SetMembersPointer(reinterpret_cast<Member*>(allocator.Realloc(GetMembersPointer(), data_.o.capacity * sizeof(Member), newCapacity * sizeof(Member))));
            data_.o.capacity = newCapacity;
        }
        return *this;
    }